

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O1

void __thiscall
ktx::CommandExtract::unpackAndSave422
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,char *data,size_t size)

{
  byte *pbVar1;
  pointer psVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  pointer pcVar6;
  uint uVar7;
  int iVar8;
  pointer psVar9;
  uint uVar10;
  pointer psVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  VkFormat vkFormat_00;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  byte bVar24;
  byte bVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  float upper_1;
  float fVar31;
  float fVar32;
  float fVar33;
  float upper_3;
  float fVar34;
  uint32_t y0Bits;
  uint32_t local_26c;
  uint local_268;
  uint32_t uBits;
  uint local_260;
  undefined4 uStack_25c;
  uint32_t local_258;
  anon_class_1_0_00000001 interpolateUV;
  anon_class_1_0_00000001 interpolateY;
  ulong local_250;
  float upper;
  float upper_2;
  float valueRightV;
  float valueRightU;
  float valueRightY0;
  float valueV;
  float valueU;
  float valueY1;
  float valueY0;
  float valueLeftV;
  float valueLeftU;
  float valueLeftY1;
  float blockSize;
  float positionV;
  float positionU;
  float positionY1;
  float positionY0;
  uint32_t channelBytes;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  vector<char,_std::allocator<char>_> unpackedData;
  anon_class_160_20_da61d305 setPixel;
  string local_c0;
  FormatDescriptor unpackedFormat;
  
  local_26c = width;
  if (*(char *)&format->basic != '\x02') {
    __assert_fail("format.model() == KHR_DF_MODEL_YUVSDA",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x227,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  psVar9 = (format->samples).
           super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar2 = (format->samples).
           super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  psVar11 = psVar9;
  if (psVar9 != psVar2) {
    do {
      if (((undefined1  [16])*psVar11 & (undefined1  [16])0xf000000) == (undefined1  [16])0x0)
      goto LAB_0018fb90;
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar2);
    psVar11 = (pointer)0x0;
LAB_0018fb90:
    if (psVar11 != (pointer)0x0) {
      if ((psVar9->field_0x3 & 0xf) != 0) {
        do {
          psVar9 = psVar9 + 1;
        } while (((undefined1  [16])*psVar9 & (undefined1  [16])0xf000000) != (undefined1  [16])0x0)
        ;
      }
      uVar7 = *(uint *)psVar9 >> 0x10 & 0xff;
      uVar18 = uVar7 + 1;
      if ((char)(*(uint *)psVar9 >> 0x10) == '\a') {
        vkFormat_00 = VK_FORMAT_R8G8B8A8_UNORM;
      }
      else if (uVar7 == 9) {
        vkFormat_00 = VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16;
      }
      else if (uVar7 == 0xb) {
        vkFormat_00 = VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16;
      }
      else {
        vkFormat_00 = VK_FORMAT_R16G16B16A16_UNORM;
        if (uVar18 != 0x10) {
          vkFormat_00 = VK_FORMAT_UNDEFINED;
        }
      }
      createFormatDescriptor(&unpackedFormat,vkFormat_00,&(this->super_Command).super_Reporter);
      FormatDescriptor::removeLastChannel(&unpackedFormat);
      local_268 = (uint)(byte)(format->basic).field_0x8;
      uVar14 = *(ulong *)&format->basic;
      local_1d0 = (ulong)(byte)unpackedFormat.basic._8_1_;
      channelBytes = (byte)unpackedFormat.basic._8_1_ / 3;
      psVar9 = (format->samples).
               super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((long)(format->samples).
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 & 0xffffffff0U) != 0x40)
      {
        __assert_fail("format.sampleCount() == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x23a,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      if ((uVar14 & 0xff00000000) != 0x100000000) {
        __assert_fail("format.basic.texelBlockDimension0 + 1 == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x23b,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      if ((char)(uVar14 >> 0x28) != '\0') {
        __assert_fail("format.basic.texelBlockDimension1 + 1 == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x23c,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      if ((char)(uVar14 >> 0x30) != '\0') {
        __assert_fail("format.basic.texelBlockDimension2 + 1 == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x23d,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      if (uVar14 >> 0x38 != 0) {
        __assert_fail("format.basic.texelBlockDimension3 + 1 == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x23e,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      uVar7 = (uint)(uVar14 >> 0x20) & 0xff;
      uVar15 = uVar7 + 1;
      uVar10 = 0;
      if ((ulong)(local_268 * height * local_26c) / (ulong)uVar15 != size) {
        __assert_fail("size == width * height * blockYUVBytes / blockDimensionX / blockDimensionY",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x23f,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      y0Bits = 0;
      uBits = 0;
      psVar2 = (format->samples).
               super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_250 = 0;
      uVar17 = 0;
      uVar28 = 0;
      local_260 = 0;
      uVar20 = 0;
      uVar26 = 0;
      iVar13 = 0;
      uVar23 = 0;
      iVar27 = 0;
      if (psVar9 != psVar2) {
        uVar29 = 0;
        uVar23 = 0;
        uVar14 = 0;
        uVar26 = 0;
        uVar20 = 0;
        local_260 = 0;
        uVar21 = 0;
        uVar17 = 0;
        local_250 = 0;
        uVar10 = 0;
        uVar19 = 0;
        do {
          uVar3 = *(ulong *)psVar9;
          uVar16 = (uint)(uVar3 >> 0x18) & 0xf;
          uVar22 = (uint)(uVar3 >> 0x20);
          uVar28 = (uint)(uVar3 >> 0x10);
          if (uVar16 == 2) {
            uVar14 = uVar3 & 0xffff;
            uVar26 = (uVar28 & 0xff) + 1;
            uVar20 = uVar22 & 0xff;
          }
          else if (uVar16 == 1) {
            uVar29 = uVar3 & 0xffff;
            uBits = (uVar28 & 0xff) + 1;
            uVar23 = uVar22 & 0xff;
          }
          else {
            if ((uVar3 & 0xf000000) != 0) {
              __assert_fail("false && \"Unsupported channel type\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                            ,0x268,
                            "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                           );
            }
            uVar28 = (uVar28 & 0xff) + 1;
            if (uVar19 == 0) {
              uVar10 = (uint)(byte)(uVar3 >> 0x20);
              local_260 = (uint)(uVar3 & 0xffff);
              uVar19 = uVar28;
              y0Bits = uVar28;
            }
            else {
              uVar21 = uVar3 >> 0x20 & 0xff;
              local_250 = uVar3 & 0xffff;
              uVar17 = uVar28;
            }
          }
          iVar13 = (int)uVar14;
          iVar27 = (int)uVar29;
          uVar28 = (uint)uVar21;
          psVar9 = psVar9 + 1;
        } while (psVar9 != psVar2);
      }
      if (uVar28 < uVar10) {
        uVar14 = (ulong)local_260;
        uVar21 = local_250;
        uVar19 = uVar10;
        uVar10 = uVar28;
        uVar28 = uVar17;
        uVar17 = y0Bits;
      }
      else {
        uVar21 = (ulong)local_260;
        uVar14 = local_250;
        uVar19 = uVar28;
        uVar28 = y0Bits;
      }
      y0Bits = uVar28;
      if (uVar18 != y0Bits) {
        __assert_fail("precision == y0Bits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x272,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      if (uVar18 != uVar17) {
        __assert_fail("precision == y1Bits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x273,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      if (uVar18 != uBits) {
        __assert_fail("precision == uBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x274,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      if (uVar18 != uVar26) {
        __assert_fail("precision == vBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x275,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      positionY0 = (float)(uVar10 * uVar15) * 0.00390625;
      positionY1 = (float)(uVar19 * uVar15) * 0.00390625;
      positionU = (float)(uVar23 * uVar15) * 0.00390625;
      blockSize = (float)uVar15;
      positionV = (float)(uVar20 * uVar15) * 0.00390625;
      local_1d0._0_4_ = (uint)(byte)unpackedFormat.basic._8_1_;
      uVar18 = height * local_26c * (uint)local_1d0;
      std::vector<char,_std::allocator<char>_>::vector
                (&unpackedData,(ulong)uVar18,(allocator_type *)&setPixel);
      local_1d8 = (ulong)local_26c / (ulong)uVar15;
      if (height != 0) {
        iVar5 = (int)local_1d8;
        fVar31 = (float)~(-1 << ((byte)uVar17 & 0x1f));
        fVar32 = (float)~(-1 << ((byte)uVar26 & 0x1f));
        local_258 = 0;
        local_1c8 = uVar14;
        do {
          if (uVar7 < local_26c) {
            local_260 = local_258 * (int)local_1d8;
            uStack_25c = 0;
            iVar8 = local_258 * local_26c;
            uVar29 = 0;
            do {
              pcVar6 = unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar30 = (int)uVar29;
              iVar12 = iVar30 + -1;
              if (iVar30 == 0) {
                iVar12 = 0;
              }
              uVar3 = uVar29 + 1;
              uVar18 = (uint)uVar3;
              if (uVar29 == iVar5 - 1U) {
                uVar18 = iVar5 - 1U;
              }
              if (0x20 < uVar17) {
LAB_0019085a:
                __assert_fail("numBits <= sizeof(T) * 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0x8d,
                              "T imageio::extract_bits(const void *, uint32_t, uint32_t) [T = unsigned int]"
                             );
              }
              uVar10 = (iVar12 + local_260) * local_268;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              bVar25 = 0;
              if (uVar17 != 0) {
                uVar15 = 0;
                do {
                  uVar20 = (int)uVar14 + uVar15;
                  bVar24 = (byte)(1 << ((byte)uVar15 & 7));
                  if (((byte)data[(ulong)(uVar20 >> 3) + (ulong)uVar10] >> (uVar20 & 7) & 1) == 0) {
                    bVar24 = bVar25;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar15 >> 3));
                  *pbVar1 = *pbVar1 | bVar24;
                  uVar15 = uVar15 + 1;
                } while (uVar17 != uVar15);
              }
              if (0x1f < uVar17 - 1) {
LAB_0019083b:
                __assert_fail("numBits > 0 && numBits <= 32",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0xcd,"float imageio::convertUNORMToFloat(uint32_t, uint32_t)");
              }
              valueLeftY1 = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar31;
              if (0x20 < uBits) goto LAB_0019085a;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (uBits != 0) {
                uVar15 = 0;
                do {
                  bVar24 = (byte)(1 << ((byte)uVar15 & 7));
                  if (((byte)data[(ulong)(iVar27 + uVar15 >> 3) + (ulong)uVar10] >>
                       (iVar27 + uVar15 & 7) & 1) == 0) {
                    bVar24 = bVar25;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar15 >> 3));
                  *pbVar1 = *pbVar1 | bVar24;
                  uVar15 = uVar15 + 1;
                } while (uBits != uVar15);
              }
              if (0x1f < uBits - 1) goto LAB_0019083b;
              fVar33 = (float)~(-1 << ((byte)uBits & 0x1f));
              valueLeftU = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar33;
              if (0x20 < uVar26) goto LAB_0019085a;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (uVar26 != 0) {
                uVar15 = 0;
                do {
                  bVar24 = (byte)(1 << ((byte)uVar15 & 7));
                  if (((byte)data[(ulong)(uVar15 + iVar13 >> 3) + (ulong)uVar10] >>
                       (uVar15 + iVar13 & 7) & 1) == 0) {
                    bVar24 = bVar25;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar15 >> 3));
                  *pbVar1 = *pbVar1 | bVar24;
                  uVar15 = uVar15 + 1;
                } while (uVar26 != uVar15);
              }
              if (0x1f < uVar26 - 1) goto LAB_0019083b;
              valueLeftV = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar32;
              if (0x20 < y0Bits) goto LAB_0019085a;
              uVar10 = (local_260 + iVar30) * local_268;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (y0Bits != 0) {
                uVar14 = 0;
                do {
                  uVar15 = (int)uVar21 + (int)uVar14;
                  bVar24 = (byte)(1 << ((byte)uVar14 & 7));
                  if (((byte)data[(ulong)(uVar15 >> 3) + (ulong)uVar10] >> (uVar15 & 7) & 1) == 0) {
                    bVar24 = bVar25;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (uVar14 >> 3));
                  *pbVar1 = *pbVar1 | bVar24;
                  uVar15 = (int)uVar14 + 1;
                  uVar14 = (ulong)uVar15;
                } while (y0Bits != uVar15);
              }
              if (0x1f < y0Bits - 1) goto LAB_0019083b;
              fVar34 = (float)~(-1 << ((byte)y0Bits & 0x1f));
              valueY0 = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar34;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (uVar17 != 0) {
                uVar14 = 0;
                do {
                  uVar15 = (int)uVar14 + (int)local_1c8;
                  bVar24 = (byte)(1 << ((byte)uVar14 & 7));
                  if (((byte)data[(ulong)(uVar15 >> 3) + (ulong)uVar10] >> (uVar15 & 7) & 1) == 0) {
                    bVar24 = bVar25;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (uVar14 >> 3));
                  *pbVar1 = *pbVar1 | bVar24;
                  uVar15 = (int)uVar14 + 1;
                  uVar14 = (ulong)uVar15;
                } while (uVar17 != uVar15);
              }
              valueY1 = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar31;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (uBits != 0) {
                uVar14 = 0;
                do {
                  uVar15 = iVar27 + (int)uVar14;
                  bVar24 = (byte)(1 << ((byte)uVar14 & 7));
                  if (((byte)data[(ulong)(uVar15 >> 3) + (ulong)uVar10] >> (uVar15 & 7) & 1) == 0) {
                    bVar24 = bVar25;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (uVar14 >> 3));
                  *pbVar1 = *pbVar1 | bVar24;
                  uVar15 = (int)uVar14 + 1;
                  uVar14 = (ulong)uVar15;
                } while (uBits != uVar15);
              }
              valueU = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar33;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (uVar26 != 0) {
                uVar14 = 0;
                do {
                  uVar15 = (int)uVar14 + iVar13;
                  bVar24 = (byte)(1 << ((byte)uVar14 & 7));
                  if (((byte)data[(ulong)(uVar15 >> 3) + (ulong)uVar10] >> (uVar15 & 7) & 1) == 0) {
                    bVar24 = bVar25;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (uVar14 >> 3));
                  *pbVar1 = *pbVar1 | bVar24;
                  uVar15 = (int)uVar14 + 1;
                  uVar14 = (ulong)uVar15;
                } while (uVar26 != uVar15);
              }
              uVar18 = (uVar18 + local_260) * local_268;
              valueV = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar32;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (y0Bits != 0) {
                uVar14 = 0;
                do {
                  uVar10 = (int)uVar21 + (int)uVar14;
                  bVar25 = (byte)(1 << ((byte)uVar14 & 7));
                  if (((byte)data[(ulong)(uVar10 >> 3) + (ulong)uVar18] >> (uVar10 & 7) & 1) == 0) {
                    bVar25 = 0;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (uVar14 >> 3));
                  *pbVar1 = *pbVar1 | bVar25;
                  uVar10 = (int)uVar14 + 1;
                  uVar14 = (ulong)uVar10;
                } while (y0Bits != uVar10);
              }
              valueRightY0 = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar34;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (uBits != 0) {
                uVar10 = 0;
                do {
                  bVar25 = (byte)(1 << ((byte)uVar10 & 7));
                  if (((byte)data[(ulong)(iVar27 + uVar10 >> 3) + (ulong)uVar18] >>
                       (iVar27 + uVar10 & 7) & 1) == 0) {
                    bVar25 = 0;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar10 >> 3));
                  *pbVar1 = *pbVar1 | bVar25;
                  uVar10 = uVar10 + 1;
                } while (uBits != uVar10);
              }
              valueRightU = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar33;
              setPixel.interpolateUV =
                   (anon_class_1_0_00000001 *)((ulong)setPixel.interpolateUV & 0xffffffff00000000);
              if (uVar26 != 0) {
                uVar10 = 0;
                do {
                  bVar25 = (byte)(1 << ((byte)uVar10 & 7));
                  if (((byte)data[(ulong)(uVar10 + iVar13 >> 3) + (ulong)uVar18] >>
                       (uVar10 + iVar13 & 7) & 1) == 0) {
                    bVar25 = 0;
                  }
                  pbVar1 = (byte *)((long)&setPixel.interpolateUV + (ulong)(uVar10 >> 3));
                  *pbVar1 = *pbVar1 | bVar25;
                  uVar10 = uVar10 + 1;
                } while (uVar26 != uVar10);
              }
              iVar30 = iVar8 + iVar30 * 2;
              iVar12 = (int)local_1d0;
              valueRightV = (float)((ulong)setPixel.interpolateUV & 0xffffffff) / fVar32;
              setPixel.interpolateUV = &interpolateUV;
              setPixel.positionV = &positionV;
              setPixel.blockSize = &blockSize;
              setPixel.valueLeftV = &valueLeftV;
              setPixel.valueV = &valueV;
              setPixel.valueRightV = &valueRightV;
              setPixel.uBits = &uBits;
              setPixel.interpolateY = &interpolateY;
              setPixel.positionY1 = &positionY1;
              setPixel.valueLeftY1 = &valueLeftY1;
              setPixel.positionY0 = &positionY0;
              setPixel.valueY0 = &valueY0;
              setPixel.valueY1 = &valueY1;
              setPixel.valueRightY0 = &valueRightY0;
              setPixel.y0Bits = &y0Bits;
              setPixel.positionU = &positionU;
              setPixel.valueLeftU = &valueLeftU;
              setPixel.valueU = &valueU;
              setPixel.valueRightU = &valueRightU;
              setPixel.channelBytes = &channelBytes;
              unpackAndSave422(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,char_const*,unsigned_long)
              ::$_0::operator()(&setPixel,
                                unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                .super__Vector_impl_data._M_start + (uint)(iVar30 * iVar12),0.5);
              unpackAndSave422(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,char_const*,unsigned_long)
              ::$_0::operator()(&setPixel,pcVar6 + (uint)((iVar30 + 1) * iVar12),1.5);
              uVar29 = uVar3;
              uVar14 = local_1c8;
            } while (uVar3 != iVar5 + (uint)(iVar5 == 0));
          }
          local_258 = local_258 + 1;
        } while (local_258 != height);
      }
      pcVar4 = (filepath->_M_dataplus)._M_p;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar4,pcVar4 + filepath->_M_string_length);
      savePNG(this,&local_c0,appendExtension,VK_FORMAT_UNDEFINED,&unpackedFormat,local_26c,height,
              unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start,
              (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (unpackedFormat.samples.
          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(unpackedFormat.samples.
                        super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)unpackedFormat.samples.
                              super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)unpackedFormat.samples.
                              super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (unpackedFormat.extended.iccProfile.profile.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(unpackedFormat.extended.iccProfile.profile.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)unpackedFormat.extended.iccProfile.profile.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)unpackedFormat.extended.iccProfile.profile.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)unpackedFormat.extended.iccProfile.name._M_dataplus._M_p !=
          &unpackedFormat.extended.iccProfile.name.field_2) {
        operator_delete(unpackedFormat.extended.iccProfile.name._M_dataplus._M_p,
                        unpackedFormat.extended.iccProfile.name.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  __assert_fail("format.find(KHR_DF_CHANNEL_YUVSDA_Y)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                ,0x228,
                "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
               );
}

Assistant:

void CommandExtract::unpackAndSave422(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        const char* data, std::size_t size) {
    (void) vkFormat;

    assert(format.model() == KHR_DF_MODEL_YUVSDA);
    assert(format.find(KHR_DF_CHANNEL_YUVSDA_Y));
    // Create a custom format with the same precision but with only 3 channels
    // Reuse similar 4 channel VkFormats and drop the last channel (There is no RGB variant of 10X6 and 12X4)
    const auto precision = format.find(KHR_DF_CHANNEL_YUVSDA_Y)->bitLength + 1u;
    auto unpackedFormat = createFormatDescriptor(
            precision == 8 ? VK_FORMAT_R8G8B8A8_UNORM :
            precision == 10 ? VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16 :
            precision == 12 ? VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16 :
            precision == 16 ? VK_FORMAT_R16G16B16A16_UNORM :
            VK_FORMAT_UNDEFINED, *this);
    unpackedFormat.removeLastChannel();

    // 1 pixel (block) with 4 channel is unpacked to 2 pixel with 3 channels: Y0,Y1,U,V -> R0,G0,B0,R1,G1,B1
    const auto blockYUVBytes = format.pixelByteCount();
    const auto blockDimensionX = format.basic.texelBlockDimension0 + 1;
    const auto blockDimensionY = format.basic.texelBlockDimension1 + 1;
    const auto pixelBytes = unpackedFormat.pixelByteCount();
    const auto channelBytes = pixelBytes / 3;
    assert(format.sampleCount() == 4);
    assert(format.basic.texelBlockDimension0 + 1 == 2);
    assert(format.basic.texelBlockDimension1 + 1 == 1);
    assert(format.basic.texelBlockDimension2 + 1 == 1);
    assert(format.basic.texelBlockDimension3 + 1 == 1);
    assert(size == width * height * blockYUVBytes / blockDimensionX / blockDimensionY);
    (void) size;
    (void) blockDimensionY;

    uint32_t y0Offset = 0;
    uint32_t y0Bits = 0;
    uint32_t y0PositionX = 0;
    uint32_t y1Offset = 0;
    uint32_t y1Bits = 0;
    uint32_t y1PositionX = 0;
    uint32_t uOffset = 0;
    uint32_t uBits = 0;
    uint32_t uPositionX = 0;
    uint32_t vOffset = 0;
    uint32_t vBits = 0;
    uint32_t vPositionX = 0;

    for (const auto& sample : format.samples) {
        switch (sample.channelType) {
        case KHR_DF_CHANNEL_YUVSDA_Y:
            if (y0Bits != 0) {
                y1Offset = sample.bitOffset;
                y1Bits = sample.bitLength + 1;
                y1PositionX = sample.samplePosition0;
            } else {
                y0Offset = sample.bitOffset;
                y0Bits = sample.bitLength + 1;
                y0PositionX = sample.samplePosition0;
            }
            break;
        case KHR_DF_CHANNEL_YUVSDA_U:
            uOffset = sample.bitOffset;
            uBits = sample.bitLength + 1;
            uPositionX = sample.samplePosition0;
            break;
        case KHR_DF_CHANNEL_YUVSDA_V:
            vOffset = sample.bitOffset;
            vBits = sample.bitLength + 1;
            vPositionX = sample.samplePosition0;
            break;
        default:
            assert(false && "Unsupported channel type");
        }
    }
    if (y0PositionX > y1PositionX) {
        // Ensure that y0 (as we refer to) is the left sample
        std::swap(y0Offset, y1Offset);
        std::swap(y0Bits, y1Bits);
        std::swap(y0PositionX, y1PositionX);
    }

    assert(precision == y0Bits);
    assert(precision == y1Bits);
    assert(precision == uBits);
    assert(precision == vBits);

    const float positionY0 = static_cast<float>(y0PositionX * blockDimensionX) / 256.f;
    const float positionY1 = static_cast<float>(y1PositionX * blockDimensionX) / 256.f;
    const float positionU = static_cast<float>(uPositionX * blockDimensionX) / 256.f;
    const float positionV = static_cast<float>(vPositionX * blockDimensionX) / 256.f;
    const float blockSize = static_cast<float>(blockDimensionX);

    std::vector<char> unpackedData(width * height * pixelBytes);

    const auto blockCountX = width / blockDimensionX;
    for (uint32_t y = 0; y < height; y++) {
        for (uint32_t x = 0; x < blockCountX; x++) {
            const char* rawYUVBlockLeft = data + (y * blockCountX + (x == 0 ? 0 : x - 1)) * blockYUVBytes;
            const char* rawYUVBlock = data + (y * blockCountX + x) * blockYUVBytes;
            const char* rawYUVBlockRight = data + (y * blockCountX + (x == blockCountX - 1 ? blockCountX - 1 : x + 1)) * blockYUVBytes;

            char* pixel0 = unpackedData.data() + (y * width + x * 2) * pixelBytes;
            char* pixel1 = unpackedData.data() + (y * width + x * 2 + 1) * pixelBytes;

            const float valueLeftY1 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, y1Offset, y1Bits), y1Bits);
            const float valueLeftU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, uOffset, uBits), uBits);
            const float valueLeftV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, vOffset, vBits), vBits);
            const float valueY0 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, y0Offset, y0Bits), y0Bits);
            const float valueY1 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, y1Offset, y1Bits), y1Bits);
            const float valueU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, uOffset, uBits), uBits);
            const float valueV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, vOffset, vBits), vBits);
            const float valueRightY0 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, y0Offset, y0Bits), y0Bits);
            const float valueRightU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, uOffset, uBits), uBits);
            const float valueRightV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, vOffset, vBits), vBits);

            const auto interpolateY = [](float pos, float pos0, float value0, float pos1, float value1, float pos2, float value2, float pos3, float value3) {
                if (pos < pos1)
                    return remap(pos, pos0, pos1, value0, value1);
                else if (pos < pos2)
                    return remap(pos, pos1, pos2, value1, value2);
                else
                    return remap(pos, pos2, pos3, value2, value3);
            };

            const auto interpolateUV = [](float pos, float pos0, float value0, float pos1, float value1, float pos2, float value2) {
                if (pos < pos1)
                    return remap(pos, pos0, pos1, value0, value1);
                else
                    return remap(pos, pos1, pos2, value1, value2);
            };

            const auto setPixel = [&](auto* pixel, float pos) {
                const auto r = convertFloatToUNORM(interpolateUV(pos,
                        positionV - blockSize, valueLeftV,
                        positionV, valueV,
                        positionV + blockSize, valueRightV), uBits);
                const auto g = convertFloatToUNORM(interpolateY(
                        pos,
                        positionY1 - blockSize, valueLeftY1,
                        positionY0, valueY0,
                        positionY1, valueY1,
                        positionY0 + blockSize, valueRightY0), y0Bits);
                const auto b = convertFloatToUNORM(interpolateUV(pos,
                        positionU - blockSize, valueLeftU,
                        positionU, valueU,
                        positionU + blockSize, valueRightU), uBits);

                const auto offsetToUsedBytes = is_big_endian ? sizeof(r) - channelBytes : 0u;
                std::memcpy(pixel + 0 * channelBytes, &r + offsetToUsedBytes, channelBytes);
                std::memcpy(pixel + 1 * channelBytes, &g + offsetToUsedBytes, channelBytes);
                std::memcpy(pixel + 2 * channelBytes, &b + offsetToUsedBytes, channelBytes);
            };

            setPixel(pixel0, 0.5f);
            setPixel(pixel1, 1.5f);
        }
    }

    // Save unpacked data as RGBSDA with the custom format
    savePNG(filepath, appendExtension, VK_FORMAT_UNDEFINED, unpackedFormat, width, height,
            reinterpret_cast<const char*>(unpackedData.data()),
            unpackedData.size() * sizeof(decltype(unpackedData)::value_type));
}